

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O3

void __thiscall VertexAttrib64Bit::ApiErrorsTest::invalidEnum(ApiErrorsTest *this,bool *result)

{
  GLenum value;
  char *__s;
  size_t sVar1;
  long lVar2;
  stringstream message;
  long *local_1d8;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  lVar2 = 0;
  do {
    value = *(GLenum *)((long)invalidEnum::type_array + lVar2);
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"VertexAttribLPointer(..., ",0x1a);
    __s = glu::getTypeName(value);
    if (__s == (char *)0x0) {
      std::ios::clear((int)(ostream *)local_1a8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
    }
    else {
      sVar1 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8," /* type */, ...)",0x11);
    (*(this->super_Base).gl.vertexAttribLPointer)(1,4,value,0,(void *)0x0);
    std::__cxx11::stringbuf::str();
    verifyError(this,0x500,(char *)local_1d8,0x19e,result);
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8,local_1c8[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x30);
  (*(this->super_Base).gl.vertexAttribLPointer)(1,4,0x140a,0,(void *)0x0);
  verifyError(this,0,"VertexAttribLPointer(..., GL_DOUBLE /* type */, ...)",0x1a2,result);
  return;
}

Assistant:

void ApiErrorsTest::invalidEnum(bool& result)
{
	/*
	 *b) GL_INVALID_ENUM should be generated by glVertexAttribLPointer()
	 *   if <type> is not GL_DOUBLE;
	 */

	static const GLenum type_array[] = { GL_BYTE,
										 GL_UNSIGNED_BYTE,
										 GL_SHORT,
										 GL_UNSIGNED_SHORT,
										 GL_INT,
										 GL_UNSIGNED_INT,
										 GL_HALF_FLOAT,
										 GL_FLOAT,
										 GL_FIXED,
										 GL_INT_2_10_10_10_REV,
										 GL_UNSIGNED_INT_2_10_10_10_REV,
										 GL_UNSIGNED_INT_10F_11F_11F_REV };
	static const GLuint type_array_length = sizeof(type_array) / sizeof(type_array[0]);

	for (GLuint i = 0; i < type_array_length; ++i)
	{
		const GLenum type = type_array[i];

		std::stringstream message;
		message << "VertexAttribLPointer(..., " << glu::getTypeName(type) << " /* type */, ...)";

		gl.vertexAttribLPointer(1 /*index */, 4 /*size */, type, 0 /* stride */, 0 /* pointer */);
		verifyError(GL_INVALID_ENUM, message.str().c_str(), __LINE__, result);
	}

	gl.vertexAttribLPointer(1 /* index */, 4 /*size */, GL_DOUBLE, 0 /* stride */, 0 /* pointer */);
	verifyError(GL_NO_ERROR, "VertexAttribLPointer(..., GL_DOUBLE /* type */, ...)", __LINE__, result);
}